

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O1

ssize_t __thiscall MetaSim::TableOutput::write(TableOutput *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  ostream *poVar2;
  ssize_t sVar3;
  BaseExc *this_00;
  long *plVar4;
  undefined4 in_register_00000034;
  BaseStat *this_01;
  double dVar5;
  ofstream f;
  string local_270;
  string local_250;
  undefined1 local_230 [16];
  char local_220 [232];
  ios_base local_138 [264];
  
  if (_created != '\0') {
    std::ofstream::ofstream((ostream *)local_230,_fname_abi_cxx11_,_S_out);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,*(char **)CONCAT44(in_register_00000034,__fd),
                        ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    this_01 = (BaseStat *)BaseStat::_statList_abi_cxx11_[2];
    if (this_01 != (BaseStat *)0x0) {
      plVar4 = BaseStat::_statList_abi_cxx11_;
      do {
        pcVar1 = (this_01->_name)._M_dataplus._M_p;
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,pcVar1,pcVar1 + (this_01->_name)._M_string_length);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_270._M_dataplus._M_p,
                            local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\t | ",5);
        dVar5 = BaseStat::getMean(this_01);
        poVar2 = std::ostream::_M_insert<double>(dVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\t | ",5);
        dVar5 = BaseStat::getConfInterval(this_01,C95);
        poVar2 = std::ostream::_M_insert<double>(dVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        plVar4 = (long *)*plVar4;
        this_01 = (BaseStat *)plVar4[2];
      } while (this_01 != (BaseStat *)0x0);
    }
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _setbuf;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    sVar3 = std::ios_base::~ios_base(local_138);
    return sVar3;
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x30);
  local_230._0_8_ = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Init function not called","")
  ;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"TableOutput","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"basestat.cpp","");
  BaseExc::BaseExc(this_00,(string *)local_230,&local_270,&local_250);
  __cxa_throw(this_00,&BaseExc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

void TableOutput::write(string message)
    {

        if (!_created) 
            throw BaseExc("Init function not called",
                          "TableOutput",
                          "basestat.cpp");

        ofstream f(_fname.c_str());
        f << message << endl;

        BaseStat::List::const_iterator i  = BaseStat::begin();
        BaseStat* p = *i;
        while (p != NULL) {
            f << p->getName() << "\t\t | "
              << p->getMean() << "\t\t | "
              << p->getConfInterval() << endl;
            ++i;
            p = *i;
        }
    }